

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O0

void p_crypto_hash_sha2_512_finish(PHashSHA2_512 *ctx)

{
  puint64 pVar1;
  puint64 pVar2;
  ulong uVar3;
  uint uVar4;
  puint words;
  int local_2c;
  pint last;
  pint left;
  puint64 low;
  puint64 high;
  PHashSHA2_512 *ctx_local;
  
  uVar4 = (uint)ctx->len_low & 0x7f;
  if (uVar4 < 0x70) {
    local_2c = 0x70 - uVar4;
  }
  else {
    local_2c = 0xf0 - uVar4;
  }
  pVar1 = ctx->len_low;
  pVar2 = ctx->len_high;
  uVar3 = ctx->len_low;
  if (0 < local_2c) {
    p_crypto_hash_sha2_512_update(ctx,pp_crypto_hash_sha2_512_pad,(long)local_2c);
  }
  (ctx->buf).buf_w[0xe] = pVar2 << 3 | uVar3 >> 0x3d;
  (ctx->buf).buf_w[0xf] = pVar1 << 3;
  pp_crypto_hash_sha2_512_swap_bytes((puint64 *)ctx,0xe);
  pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
  words = 6;
  if (ctx->is384 == 0) {
    words = 8;
  }
  pp_crypto_hash_sha2_512_swap_bytes(ctx->hash,words);
  return;
}

Assistant:

void
p_crypto_hash_sha2_512_finish (PHashSHA2_512 *ctx)
{
	puint64	high;
	puint64	low;
	pint	left;
	pint	last;

	left = (pint) (ctx->len_low & 0x7F);
	last = (left < 112) ? (112 - left) : (240 - left);

	low = ctx->len_low << 3;
	high = ctx->len_high << 3
	     | ctx->len_low >> 61;

	if (last > 0)
		p_crypto_hash_sha2_512_update (ctx, pp_crypto_hash_sha2_512_pad, (psize) last);

	ctx->buf.buf_w[14] = high;
	ctx->buf.buf_w[15] = low;

	pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 14);
	pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

	pp_crypto_hash_sha2_512_swap_bytes (ctx->hash, ctx->is384 == FALSE ? 8 : 6);
}